

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O0

void __thiscall IteratorTest::arithmeticOperatorsTest<false>(IteratorTest *this)

{
  allocator<int> *paVar1;
  undefined1 *puVar2;
  reference pvVar3;
  iterator iVar4;
  iterator iVar5;
  reference piVar6;
  Iterator<int,_false,_std::allocator<unsigned_long>_> *pIVar7;
  reference piVar8;
  Iterator<int,_true,_std::allocator<unsigned_long>_> *pIVar9;
  bool local_1699;
  iterator local_1698;
  bool local_1662;
  bool local_1661;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_1660;
  int local_162c;
  undefined1 local_1628 [4];
  int i_17;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_15f8;
  undefined1 local_15c8 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_17;
  undefined1 local_1580 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_17;
  undefined1 local_1538 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_17;
  const_iterator local_1518;
  bool local_14e2;
  bool local_14e1;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_14e0;
  int local_14ac;
  undefined1 local_14a8 [4];
  int i_16;
  undefined1 local_1478 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_16;
  undefined1 local_1430 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_16;
  undefined1 local_13e8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_16;
  iterator local_13c8;
  bool local_1392;
  bool local_1391;
  Iterator<int,_false,_std::allocator<unsigned_long>_> local_1390;
  int local_135c;
  undefined1 local_1358 [4];
  int i_15;
  undefined1 local_1328 [8];
  Iterator<int,_false,_std::allocator<unsigned_long>_> it_15;
  undefined1 local_12e0 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_15;
  undefined1 local_1298 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_15;
  iterator local_1278;
  bool local_1241;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_1240;
  bool local_120d;
  int local_120c;
  undefined1 local_1208 [4];
  int i_14;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_11d8;
  undefined1 local_11a8 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_14;
  undefined1 local_1160 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_14;
  undefined1 local_1118 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_14;
  const_iterator local_10f8;
  bool local_10c1;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_10c0;
  bool local_108d;
  int local_108c;
  undefined1 local_1088 [4];
  int i_13;
  undefined1 local_1058 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_13;
  undefined1 local_1010 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_13;
  undefined1 local_fc8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_13;
  iterator local_fa8;
  bool local_f71;
  Iterator<int,_false,_std::allocator<unsigned_long>_> local_f70;
  bool local_f3d;
  int local_f3c;
  undefined1 local_f38 [4];
  int i_12;
  undefined1 local_f08 [8];
  Iterator<int,_false,_std::allocator<unsigned_long>_> it_12;
  undefined1 local_ec0 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_12;
  undefined1 local_e78 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_12;
  iterator local_e58;
  bool local_e26;
  bool local_e25;
  int local_e24;
  undefined1 local_e20 [4];
  int i_11;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_df0;
  undefined1 local_dc0 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_11;
  undefined1 local_d78 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_11;
  undefined1 local_d30 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_11;
  const_iterator local_d10;
  bool local_cde;
  bool local_cdd;
  int local_cdc;
  undefined1 local_cd8 [4];
  int i_10;
  undefined1 local_ca8 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_10;
  undefined1 local_c60 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_10;
  undefined1 local_c18 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_10;
  iterator local_bf8;
  bool local_bc6;
  bool local_bc5;
  int local_bc4;
  undefined1 local_bc0 [4];
  int i_9;
  undefined1 local_b90 [8];
  Iterator<int,_false,_std::allocator<unsigned_long>_> it_9;
  undefined1 local_b48 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_9;
  undefined1 local_b00 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_9;
  iterator local_ae0;
  bool local_aae;
  bool local_aad;
  int local_aac;
  undefined1 local_aa8 [4];
  int i_8;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_a78;
  undefined1 local_a48 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_8;
  undefined1 local_a00 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_8;
  undefined1 local_9b8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_8;
  const_iterator local_998;
  bool local_966;
  bool local_965;
  int local_964;
  undefined1 local_960 [4];
  int i_7;
  undefined1 local_930 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_7;
  undefined1 local_8e8 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_7;
  undefined1 local_8a0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_7;
  iterator local_880;
  bool local_84e;
  bool local_84d;
  int local_84c;
  undefined1 local_848 [4];
  int i_6;
  undefined1 local_818 [8];
  Iterator<int,_false,_std::allocator<unsigned_long>_> it_6;
  undefined1 local_7d0 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_6;
  undefined1 local_788 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_6;
  iterator local_768;
  bool local_732;
  bool local_731;
  difference_type local_730;
  int local_724;
  undefined1 local_720 [4];
  int i_5;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_6f0;
  undefined1 local_6c0 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_5;
  undefined1 local_678 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_5;
  undefined1 local_630 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_5;
  const_iterator local_610;
  bool local_5da;
  bool local_5d9;
  difference_type local_5d8;
  int local_5cc;
  undefined1 local_5c8 [4];
  int i_4;
  undefined1 local_598 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_4;
  undefined1 local_550 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_4;
  undefined1 local_508 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_4;
  iterator local_4e8;
  bool local_4b2;
  bool local_4b1;
  difference_type local_4b0;
  int local_4a4;
  undefined1 local_4a0 [4];
  int i_3;
  undefined1 local_470 [8];
  Iterator<int,_false,_std::allocator<unsigned_long>_> it_3;
  undefined1 local_428 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_3;
  undefined1 local_3e0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_3;
  iterator local_3c0;
  bool local_389;
  difference_type local_388;
  bool local_37d;
  int local_37c;
  undefined1 local_378 [4];
  int i_2;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_348;
  undefined1 local_318 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_2;
  undefined1 local_2d0 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_2;
  undefined1 local_288 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_2;
  const_iterator local_268;
  bool local_231;
  difference_type local_230;
  bool local_225;
  int local_224;
  undefined1 local_220 [4];
  int i_1;
  undefined1 local_1f0 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_1;
  undefined1 local_1a8 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_1;
  undefined1 local_160 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_1;
  iterator local_140;
  bool local_109;
  difference_type local_108;
  bool local_fd;
  int local_fc;
  undefined1 local_f8 [4];
  int i;
  undefined1 local_c8 [8];
  Iterator<int,_false,_std::allocator<unsigned_long>_> it;
  undefined1 local_80 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v;
  allocator<unsigned_long> local_29;
  undefined1 local_28 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  IteratorTest *this_local;
  
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<unsigned_long>::allocator(&local_29);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,1,&local_29);
  std::allocator<unsigned_long>::~allocator(&local_29);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,0);
  *pvVar3 = 0x18;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  paVar1 = (allocator<int> *)
           ((long)&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_80,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_c8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_f8,(View<int,_false,_std::allocator<unsigned_long>_> *)local_80);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_c8,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_f8);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_f8);
  for (local_fc = 0; local_fc < 0x18; local_fc = local_fc + 1) {
    piVar6 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_c8);
    local_fd = *piVar6 == this->data_[local_fc];
    test(&local_fd);
    local_108 = 1;
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator+=
              ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_c8,&local_108);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            (&local_140,(View<int,_false,_std::allocator<unsigned_long>_> *)local_80);
  local_109 = andres::Iterator<int,false,std::allocator<unsigned_long>>::operator==
                        ((Iterator<int,false,std::allocator<unsigned_long>> *)local_c8,&local_140);
  test(&local_109);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_140);
  pIVar7 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator--
                     ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_c8);
  piVar6 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*(pIVar7);
  shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar6 == 0x2e;
  test((bool *)((long)&shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_c8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_80);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  puVar2 = &v_1.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_160,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_1.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_160,0);
  *pvVar3 = 0x18;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_160);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_160);
  paVar1 = (allocator<int> *)
           ((long)&it_1.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_1a8,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_1.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1f0);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((const_iterator *)local_220,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_1a8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1f0,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_220);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_220);
  for (local_224 = 0; local_224 < 0x18; local_224 = local_224 + 1) {
    piVar8 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1f0);
    local_225 = *piVar8 == this->data_[local_224];
    test(&local_225);
    local_230 = 1;
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator+=
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1f0,&local_230);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            (&local_268,(View<int,_true,_std::allocator<unsigned_long>_> *)local_1a8);
  local_231 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                        ((Iterator<int,true,std::allocator<unsigned_long>> *)local_1f0,&local_268);
  test(&local_231);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_268);
  pIVar9 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1f0);
  piVar8 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar9);
  shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar8 == 0x2e;
  test((bool *)((long)&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1f0);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1a8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_160);
  puVar2 = &v_2.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_288,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_2.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_288,0);
  *pvVar3 = 0x18;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_288);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_288);
  paVar1 = (allocator<int> *)
           ((long)&it_2.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_2d0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_2.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_318);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_378,(View<int,_false,_std::allocator<unsigned_long>_> *)local_2d0);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_348,(Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_378);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_318,&local_348);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_348);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_378);
  for (local_37c = 0; local_37c < 0x18; local_37c = local_37c + 1) {
    piVar8 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_318);
    local_37d = *piVar8 == this->data_[local_37c];
    test(&local_37d);
    local_388 = 1;
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator+=
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_318,&local_388);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            (&local_3c0,(View<int,_false,_std::allocator<unsigned_long>_> *)local_2d0);
  local_389 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                        ((Iterator<int,true,std::allocator<unsigned_long>> *)local_318,&local_3c0);
  test(&local_389);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_3c0);
  pIVar9 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_318);
  piVar8 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar9);
  shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar8 == 0x2e;
  test((bool *)((long)&shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_318);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_2d0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_288);
  puVar2 = &v_3.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3e0,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_3.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3e0,0);
  *pvVar3 = 0x18;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3e0);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3e0);
  paVar1 = (allocator<int> *)
           ((long)&it_3.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_428,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_3.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_470);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            ((iterator *)local_4a0,(View<int,_false,_std::allocator<unsigned_long>_> *)local_428);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_470,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_4a0);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_4a0);
  for (local_4a4 = 0x17; -1 < local_4a4; local_4a4 = local_4a4 + -1) {
    local_4b0 = 1;
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator-=
              ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_470,&local_4b0);
    piVar6 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_470);
    local_4b1 = *piVar6 == this->data_[local_4a4];
    test(&local_4b1);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            (&local_4e8,(View<int,_false,_std::allocator<unsigned_long>_> *)local_428);
  local_4b2 = andres::Iterator<int,false,std::allocator<unsigned_long>>::operator==
                        ((Iterator<int,false,std::allocator<unsigned_long>> *)local_470,&local_4e8);
  test(&local_4b2);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_4e8);
  piVar6 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*
                     ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_470);
  shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar6 == 0;
  test((bool *)((long)&shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_470);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_428);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3e0);
  puVar2 = &v_4.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_508,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_4.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_508,0);
  *pvVar3 = 0x18;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_508);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_508);
  paVar1 = (allocator<int> *)
           ((long)&it_4.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_550,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_4.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_598);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            ((const_iterator *)local_5c8,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_550);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_598,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_5c8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_5c8);
  for (local_5cc = 0x17; -1 < local_5cc; local_5cc = local_5cc + -1) {
    local_5d8 = 1;
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator-=
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_598,&local_5d8);
    piVar8 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_598);
    local_5d9 = *piVar8 == this->data_[local_5cc];
    test(&local_5d9);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            (&local_610,(View<int,_true,_std::allocator<unsigned_long>_> *)local_550);
  local_5da = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                        ((Iterator<int,true,std::allocator<unsigned_long>> *)local_598,&local_610);
  test(&local_5da);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_610);
  piVar8 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_598);
  shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar8 == 0;
  test((bool *)((long)&shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_598);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_550);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_508);
  puVar2 = &v_5.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_630,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_5.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_630,0);
  *pvVar3 = 0x18;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_630);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_630);
  paVar1 = (allocator<int> *)
           ((long)&it_5.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_678,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_5.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_6c0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            ((iterator *)local_720,(View<int,_false,_std::allocator<unsigned_long>_> *)local_678);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_6f0,(Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_720);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_6c0,&local_6f0);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_6f0);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_720);
  for (local_724 = 0x17; -1 < local_724; local_724 = local_724 + -1) {
    local_730 = 1;
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator-=
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_6c0,&local_730);
    piVar8 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_6c0);
    local_731 = *piVar8 == this->data_[local_724];
    test(&local_731);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            (&local_768,(View<int,_false,_std::allocator<unsigned_long>_> *)local_678);
  local_732 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                        ((Iterator<int,true,std::allocator<unsigned_long>> *)local_6c0,&local_768);
  test(&local_732);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_768);
  piVar8 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_6c0);
  shape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar8 == 0;
  test((bool *)((long)&shape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_6c0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_678);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_630);
  puVar2 = &v_6.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_788,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_6.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_788,0);
  *pvVar3 = 0x18;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_788);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_788);
  paVar1 = (allocator<int> *)
           ((long)&it_6.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_7d0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_6.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_818);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_848,(View<int,_false,_std::allocator<unsigned_long>_> *)local_7d0);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_818,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_848);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_848);
  for (local_84c = 0; local_84c < 0x18; local_84c = local_84c + 1) {
    piVar6 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_818);
    local_84d = *piVar6 == this->data_[local_84c];
    test(&local_84d);
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_818);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            (&local_880,(View<int,_false,_std::allocator<unsigned_long>_> *)local_7d0);
  local_84e = andres::Iterator<int,false,std::allocator<unsigned_long>>::operator==
                        ((Iterator<int,false,std::allocator<unsigned_long>> *)local_818,&local_880);
  test(&local_84e);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_880);
  pIVar7 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator--
                     ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_818);
  piVar6 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*(pIVar7);
  shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar6 == 0x2e;
  test((bool *)((long)&shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_818);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_7d0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_788);
  puVar2 = &v_7.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_8a0,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_7.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_8a0,0);
  *pvVar3 = 0x18;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_8a0);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_8a0);
  paVar1 = (allocator<int> *)
           ((long)&it_7.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_8e8,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_7.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_930);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((const_iterator *)local_960,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_8e8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_930,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_960);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_960);
  for (local_964 = 0; local_964 < 0x18; local_964 = local_964 + 1) {
    piVar8 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_930);
    local_965 = *piVar8 == this->data_[local_964];
    test(&local_965);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_930);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            (&local_998,(View<int,_true,_std::allocator<unsigned_long>_> *)local_8e8);
  local_966 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                        ((Iterator<int,true,std::allocator<unsigned_long>> *)local_930,&local_998);
  test(&local_966);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_998);
  pIVar9 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_930);
  piVar8 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar9);
  shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar8 == 0x2e;
  test((bool *)((long)&shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_930);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_8e8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_8a0);
  puVar2 = &v_8.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_9b8,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_8.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_9b8,0);
  *pvVar3 = 0x18;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_9b8);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_9b8);
  paVar1 = (allocator<int> *)
           ((long)&it_8.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_a00,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_8.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_a48);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_aa8,(View<int,_false,_std::allocator<unsigned_long>_> *)local_a00);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_a78,(Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_aa8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_a48,&local_a78);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_a78);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_aa8);
  for (local_aac = 0; local_aac < 0x18; local_aac = local_aac + 1) {
    piVar8 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_a48);
    local_aad = *piVar8 == this->data_[local_aac];
    test(&local_aad);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_a48);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            (&local_ae0,(View<int,_false,_std::allocator<unsigned_long>_> *)local_a00);
  local_aae = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                        ((Iterator<int,true,std::allocator<unsigned_long>> *)local_a48,&local_ae0);
  test(&local_aae);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_ae0);
  pIVar9 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_a48);
  piVar8 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar9);
  shape_9.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar8 == 0x2e;
  test((bool *)((long)&shape_9.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_a48);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_9b8);
  puVar2 = &v_9.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b00,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_9.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b00,0);
  *pvVar3 = 0x18;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b00);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b00);
  paVar1 = (allocator<int> *)
           ((long)&it_9.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_b48,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_9.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_b90);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            ((iterator *)local_bc0,(View<int,_false,_std::allocator<unsigned_long>_> *)local_b48);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_b90,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_bc0);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_bc0);
  for (local_bc4 = 0x17; -1 < local_bc4; local_bc4 = local_bc4 + -1) {
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator--
              ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_b90);
    piVar6 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_b90);
    local_bc5 = *piVar6 == this->data_[local_bc4];
    test(&local_bc5);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            (&local_bf8,(View<int,_false,_std::allocator<unsigned_long>_> *)local_b48);
  local_bc6 = andres::Iterator<int,false,std::allocator<unsigned_long>>::operator==
                        ((Iterator<int,false,std::allocator<unsigned_long>> *)local_b90,&local_bf8);
  test(&local_bc6);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_bf8);
  piVar6 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*
                     ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_b90);
  shape_10.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar6 == 0;
  test((bool *)((long)&shape_10.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_b90);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b48);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b00);
  puVar2 = &v_10.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c18,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_10.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c18,0);
  *pvVar3 = 0x18;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c18);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c18);
  paVar1 = (allocator<int> *)
           ((long)&it_10.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_c60,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_10.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_ca8);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            ((const_iterator *)local_cd8,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_c60);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_ca8,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_cd8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_cd8);
  for (local_cdc = 0x17; -1 < local_cdc; local_cdc = local_cdc + -1) {
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_ca8);
    piVar8 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_ca8);
    local_cdd = *piVar8 == this->data_[local_cdc];
    test(&local_cdd);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            (&local_d10,(View<int,_true,_std::allocator<unsigned_long>_> *)local_c60);
  local_cde = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                        ((Iterator<int,true,std::allocator<unsigned_long>> *)local_ca8,&local_d10);
  test(&local_cde);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_d10);
  piVar8 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_ca8);
  shape_11.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar8 == 0;
  test((bool *)((long)&shape_11.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_ca8);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_c60);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c18);
  puVar2 = &v_11.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d30,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_11.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d30,0);
  *pvVar3 = 0x18;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d30);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d30);
  paVar1 = (allocator<int> *)
           ((long)&it_11.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_d78,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_11.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_dc0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            ((iterator *)local_e20,(View<int,_false,_std::allocator<unsigned_long>_> *)local_d78);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_df0,(Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_e20);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_dc0,&local_df0);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_df0);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_e20);
  for (local_e24 = 0x17; -1 < local_e24; local_e24 = local_e24 + -1) {
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_dc0);
    piVar8 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_dc0);
    local_e25 = *piVar8 == this->data_[local_e24];
    test(&local_e25);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            (&local_e58,(View<int,_false,_std::allocator<unsigned_long>_> *)local_d78);
  local_e26 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                        ((Iterator<int,true,std::allocator<unsigned_long>> *)local_dc0,&local_e58);
  test(&local_e26);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_e58);
  piVar8 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_dc0);
  shape_12.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar8 == 0;
  test((bool *)((long)&shape_12.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_dc0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d78);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d30);
  puVar2 = &v_12.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_e78,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_12.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_e78,0);
  *pvVar3 = 0x18;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_e78);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_e78);
  paVar1 = (allocator<int> *)
           ((long)&it_12.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_ec0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_12.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_f08);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_f38,(View<int,_false,_std::allocator<unsigned_long>_> *)local_ec0);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_f08,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_f38);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_f38);
  for (local_f3c = 0; local_f3c < 0x18; local_f3c = local_f3c + 1) {
    piVar6 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_f08);
    local_f3d = *piVar6 == this->data_[local_f3c];
    test(&local_f3d);
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++
              (&local_f70,(Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_f08,0);
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_f70);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            (&local_fa8,(View<int,_false,_std::allocator<unsigned_long>_> *)local_ec0);
  local_f71 = andres::Iterator<int,false,std::allocator<unsigned_long>>::operator==
                        ((Iterator<int,false,std::allocator<unsigned_long>> *)local_f08,&local_fa8);
  test(&local_f71);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_fa8);
  pIVar7 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator--
                     ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_f08);
  piVar6 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*(pIVar7);
  shape_13.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar6 == 0x2e;
  test((bool *)((long)&shape_13.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_f08);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_ec0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_e78);
  puVar2 = &v_13.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_fc8,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_13.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_fc8,0);
  *pvVar3 = 0x18;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_fc8);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_fc8);
  paVar1 = (allocator<int> *)
           ((long)&it_13.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_1010,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_13.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1058);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((const_iterator *)local_1088,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_1010);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1058,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1088);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1088);
  for (local_108c = 0; local_108c < 0x18; local_108c = local_108c + 1) {
    piVar8 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1058);
    local_108d = *piVar8 == this->data_[local_108c];
    test(&local_108d);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              (&local_10c0,(Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1058,0);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_10c0);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            (&local_10f8,(View<int,_true,_std::allocator<unsigned_long>_> *)local_1010);
  local_10c1 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                         ((Iterator<int,true,std::allocator<unsigned_long>> *)local_1058,&local_10f8
                         );
  test(&local_10c1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_10f8);
  pIVar9 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1058);
  piVar8 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar9);
  shape_14.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar8 == 0x2e;
  test((bool *)((long)&shape_14.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1058);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1010);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_fc8);
  puVar2 = &v_14.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1118,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_14.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1118,0);
  *pvVar3 = 0x18;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1118);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1118);
  paVar1 = (allocator<int> *)
           ((long)&it_14.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_1160,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_14.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_11a8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_1208,(View<int,_false,_std::allocator<unsigned_long>_> *)local_1160);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_11d8,(Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1208);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_11a8,&local_11d8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_11d8);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1208);
  for (local_120c = 0; local_120c < 0x18; local_120c = local_120c + 1) {
    piVar8 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_11a8);
    local_120d = *piVar8 == this->data_[local_120c];
    test(&local_120d);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              (&local_1240,(Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_11a8,0);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_1240);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            (&local_1278,(View<int,_false,_std::allocator<unsigned_long>_> *)local_1160);
  local_1241 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                         ((Iterator<int,true,std::allocator<unsigned_long>> *)local_11a8,&local_1278
                         );
  test(&local_1241);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_1278);
  pIVar9 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_11a8);
  piVar8 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar9);
  shape_15.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar8 == 0x2e;
  test((bool *)((long)&shape_15.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_11a8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1160);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1118);
  puVar2 = &v_15.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1298,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_15.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1298,0);
  *pvVar3 = 0x18;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1298);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1298);
  paVar1 = (allocator<int> *)
           ((long)&it_15.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_12e0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_15.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1328);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            ((iterator *)local_1358,(View<int,_false,_std::allocator<unsigned_long>_> *)local_12e0);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1328,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1358);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1358);
  for (local_135c = 0x17; -1 < local_135c; local_135c = local_135c + -1) {
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator--
              (&local_1390,(Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1328,0);
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_1390);
    piVar6 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1328);
    local_1391 = *piVar6 == this->data_[local_135c];
    test(&local_1391);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            (&local_13c8,(View<int,_false,_std::allocator<unsigned_long>_> *)local_12e0);
  local_1392 = andres::Iterator<int,false,std::allocator<unsigned_long>>::operator==
                         ((Iterator<int,false,std::allocator<unsigned_long>> *)local_1328,
                          &local_13c8);
  test(&local_1392);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_13c8);
  piVar6 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*
                     ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1328);
  shape_16.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar6 == 0;
  test((bool *)((long)&shape_16.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1328);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_12e0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1298);
  puVar2 = &v_16.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_13e8,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_16.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_13e8,0);
  *pvVar3 = 0x18;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_13e8);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_13e8);
  paVar1 = (allocator<int> *)
           ((long)&it_16.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_1430,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_16.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1478);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            ((const_iterator *)local_14a8,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_1430);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1478,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_14a8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_14a8);
  for (local_14ac = 0x17; -1 < local_14ac; local_14ac = local_14ac + -1) {
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
              (&local_14e0,(Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1478,0);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_14e0);
    piVar8 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1478);
    local_14e1 = *piVar8 == this->data_[local_14ac];
    test(&local_14e1);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            (&local_1518,(View<int,_true,_std::allocator<unsigned_long>_> *)local_1430);
  local_14e2 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                         ((Iterator<int,true,std::allocator<unsigned_long>> *)local_1478,&local_1518
                         );
  test(&local_14e2);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_1518);
  piVar8 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1478);
  shape_17.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar8 == 0;
  test((bool *)((long)&shape_17.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1478);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1430);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_13e8);
  puVar2 = &v_17.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1538,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_17.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1538,0);
  *pvVar3 = 0x18;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1538);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1538);
  paVar1 = (allocator<int> *)
           ((long)&it_17.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_1580,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_17.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_15c8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            ((iterator *)local_1628,(View<int,_false,_std::allocator<unsigned_long>_> *)local_1580);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_15f8,(Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1628);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_15c8,&local_15f8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_15f8);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1628);
  for (local_162c = 0x17; -1 < local_162c; local_162c = local_162c + -1) {
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
              (&local_1660,(Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_15c8,0);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_1660);
    piVar8 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_15c8);
    local_1661 = *piVar8 == this->data_[local_162c];
    test(&local_1661);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            (&local_1698,(View<int,_false,_std::allocator<unsigned_long>_> *)local_1580);
  local_1662 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                         ((Iterator<int,true,std::allocator<unsigned_long>> *)local_15c8,&local_1698
                         );
  test(&local_1662);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_1698);
  piVar8 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_15c8);
  local_1699 = *piVar8 == 0;
  test(&local_1699);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_15c8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1580);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1538);
  return;
}

Assistant:

void IteratorTest::arithmeticOperatorsTest(){
    // operator+=
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            it += 1;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            it += 1;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            it += 1;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    // operator-=
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.end();

        
        for(int i = 23; i >= 0; --i){
            it -= 1;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            it -= 1;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            it -= 1;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    // operator++ prefix
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            ++it;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            ++it;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            ++it;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    // operator-- prefix
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            --it;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            --it;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            --it;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    // operator++ postfix
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            it++;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            it++;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            it++;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    // operator-- postfix
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            it--;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            it--;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            it--;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
}